

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddLibraryCommand.cxx
# Opt level: O2

bool cmAddLibraryCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *args,cmExecutionStatus *status)

{
  cmMakefile *this;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool global;
  bool bVar4;
  bool bVar5;
  PolicyStatus PVar6;
  cmState *this_00;
  cmTarget *pcVar7;
  long lVar8;
  string *psVar9;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  TargetType TVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  srcs;
  cmAlphaNum local_80;
  string local_50;
  
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&srcs,"called with incorrect number of arguments",
               (allocator<char> *)&local_80);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  else {
    this = status->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&srcs,"BUILD_SHARED_LIBS",(allocator<char> *)&local_80);
    cmMakefile::GetDefinition(this,(string *)&srcs);
    bVar2 = cmIsOff((cmValue)0x2bcd1c);
    std::__cxx11::string::~string((string *)&srcs);
    TVar10 = SHARED_LIBRARY - bVar2;
    psVar9 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    global = false;
    bVar1 = false;
    bVar2 = false;
    bVar4 = false;
    bVar5 = false;
    __first._M_current = psVar9;
    while (__first._M_current = __first._M_current + 1,
          __first._M_current !=
          (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::string((string *)&srcs,(string *)__first._M_current);
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &srcs,"STATIC");
      if (bVar3) {
        bVar2 = true;
        bVar3 = TVar10 == INTERFACE_LIBRARY;
        TVar10 = STATIC_LIBRARY;
        if (bVar3) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_80,"INTERFACE library specified with conflicting STATIC type."
                     ,(allocator<char> *)&local_50);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_002bd0ba;
        }
      }
      else {
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&srcs,"SHARED");
        if (bVar3) {
          bVar2 = true;
          bVar3 = TVar10 == INTERFACE_LIBRARY;
          TVar10 = SHARED_LIBRARY;
          if (bVar3) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_80,
                       "INTERFACE library specified with conflicting SHARED type.",
                       (allocator<char> *)&local_50);
            std::__cxx11::string::_M_assign((string *)&status->Error);
            goto LAB_002bd0ba;
          }
        }
        else {
          bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&srcs,"MODULE");
          if (bVar3) {
            bVar2 = true;
            bVar3 = TVar10 == INTERFACE_LIBRARY;
            TVar10 = MODULE_LIBRARY;
            if (bVar3) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_80,
                         "INTERFACE library specified with conflicting MODULE type.",
                         (allocator<char> *)&local_50);
              std::__cxx11::string::_M_assign((string *)&status->Error);
              goto LAB_002bd0ba;
            }
          }
          else {
            bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&srcs,"OBJECT");
            if (bVar3) {
              bVar2 = true;
              bVar3 = TVar10 == INTERFACE_LIBRARY;
              TVar10 = OBJECT_LIBRARY;
              if (bVar3) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_80,
                           "INTERFACE library specified with conflicting OBJECT type.",
                           (allocator<char> *)&local_50);
                std::__cxx11::string::_M_assign((string *)&status->Error);
                goto LAB_002bd0ba;
              }
            }
            else {
              bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&srcs,"UNKNOWN");
              if (bVar3) {
                bVar2 = true;
                bVar3 = TVar10 == INTERFACE_LIBRARY;
                TVar10 = UNKNOWN_LIBRARY;
                if (bVar3) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_80,
                             "INTERFACE library specified with conflicting UNKNOWN type.",
                             (allocator<char> *)&local_50);
                  std::__cxx11::string::_M_assign((string *)&status->Error);
                  goto LAB_002bd0ba;
                }
              }
              else {
                bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&srcs,"ALIAS");
                if (bVar3) {
                  bVar4 = true;
                  if (TVar10 == INTERFACE_LIBRARY) {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_80,
                               "INTERFACE library specified with conflicting ALIAS type.",
                               (allocator<char> *)&local_50);
                    std::__cxx11::string::_M_assign((string *)&status->Error);
                    goto LAB_002bd0ba;
                  }
                }
                else {
                  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&srcs,"INTERFACE");
                  if (bVar3) {
                    if (bVar2) {
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_80,
                                 "INTERFACE library specified with conflicting/multiple types.",
                                 (allocator<char> *)&local_50);
                      std::__cxx11::string::_M_assign((string *)&status->Error);
                    }
                    else {
                      bVar2 = true;
                      TVar10 = INTERFACE_LIBRARY;
                      if (!bVar4) goto LAB_002bcf00;
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_80,
                                 "INTERFACE library specified with conflicting ALIAS type.",
                                 (allocator<char> *)&local_50);
                      std::__cxx11::string::_M_assign((string *)&status->Error);
                    }
LAB_002bd0ba:
                    std::__cxx11::string::~string((string *)&local_80);
                    goto LAB_002bd183;
                  }
                  bVar3 = std::operator==(__first._M_current,"EXCLUDE_FROM_ALL");
                  if (bVar3) {
                    bVar5 = true;
                  }
                  else {
                    bVar3 = std::operator==(__first._M_current,"IMPORTED");
                    if (bVar3) {
                      bVar1 = true;
                    }
                    else {
                      if ((!bVar1) || (bVar3 = std::operator==(__first._M_current,"GLOBAL"), !bVar3)
                         ) {
                        if ((TVar10 == INTERFACE_LIBRARY) &&
                           (bVar3 = std::operator==(__first._M_current,"GLOBAL"), bVar3)) {
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&local_80,
                                     "GLOBAL option may only be used with IMPORTED libraries.",
                                     (allocator<char> *)&local_50);
                          std::__cxx11::string::_M_assign((string *)&status->Error);
                          goto LAB_002bd0ba;
                        }
                        std::__cxx11::string::~string((string *)&srcs);
                        break;
                      }
                      global = true;
                    }
                  }
                }
              }
            }
          }
        }
      }
LAB_002bcf00:
      std::__cxx11::string::~string((string *)&srcs);
    }
    if (bVar1) {
      bVar1 = true;
      if (global == false) {
        global = cmMakefile::IsImportedTargetGlobalScope(this);
      }
    }
    else {
      bVar1 = false;
    }
    if (((TVar10 != INTERFACE_LIBRARY) || (bVar1)) || (global == false)) {
      bVar3 = cmGeneratorExpression::IsValidTargetName(psVar9);
      if (bVar3) {
        bVar3 = cmGlobalGenerator::IsReservedTarget(psVar9);
        if ((bVar3 || bVar1) || (bVar4)) {
          if (bVar3) goto LAB_002bd1de;
        }
        else {
          lVar8 = std::__cxx11::string::find((char)psVar9,0x3a);
          if (lVar8 != -1) goto LAB_002bd1de;
        }
      }
      else {
LAB_002bd1de:
        bVar3 = cmMakefile::CheckCMP0037(this,psVar9,TVar10);
        if (!bVar3) {
          return false;
        }
      }
      if (!bVar4) {
        if ((bVar1) && (bVar5 != false)) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&srcs,"excludeFromAll with IMPORTED target makes no sense.",
                     (allocator<char> *)&local_80);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_002bd183;
        }
        if ((TVar10 & ~STATIC_LIBRARY) == SHARED_LIBRARY) {
          this_00 = cmMakefile::GetState(this);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&srcs,"TARGET_SUPPORTS_SHARED_LIBS",(allocator<char> *)&local_80);
          bVar4 = cmState::GetGlobalPropertyAsBool(this_00,(string *)&srcs);
          std::__cxx11::string::~string((string *)&srcs);
          if (bVar4) goto LAB_002bd2d3;
          srcs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)&DAT_00000018;
          local_80.View_._M_str = "MODULE";
          if (TVar10 == SHARED_LIBRARY) {
            local_80.View_._M_str = "SHARED";
          }
          srcs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)anon_var_dwarf_b43012;
          local_80.View_._M_len = 6;
          cmStrCat<char[67],char[62]>
                    (&local_50,(cmAlphaNum *)&srcs,&local_80,
                     (char (*) [67])
                     " option but the target platform does not support dynamic linking. ",
                     (char (*) [62])"Building a STATIC library instead. This may lead to problems.")
          ;
          cmMakefile::IssueMessage(this,AUTHOR_WARNING,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          if (bVar1) {
            if (!bVar2) goto LAB_002bd4b9;
            TVar10 = STATIC_LIBRARY;
            goto LAB_002bd447;
          }
          TVar10 = STATIC_LIBRARY;
LAB_002bd588:
          srcs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)&srcs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
          srcs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          srcs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
          bVar2 = cmMakefile::EnforceUniqueName(this,psVar9,(string *)&srcs,false);
          if (!bVar2) {
            std::__cxx11::string::_M_assign((string *)&status->Error);
            goto LAB_002bd183;
          }
          std::__cxx11::string::~string((string *)&srcs);
          if ((TVar10 != INTERFACE_LIBRARY) ||
             ((bVar2 = cmGeneratorExpression::IsValidTargetName(psVar9), bVar2 &&
              (lVar8 = std::__cxx11::string::find((char *)psVar9,0x60064b), lVar8 == -1)))) {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            vector<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&srcs,
                       __first,(args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish,
                       (allocator_type *)&local_80);
            cmMakefile::AddLibrary(this,psVar9,TVar10,&srcs,bVar5);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&srcs);
            return true;
          }
          srcs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x2b;
          srcs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)anon_var_dwarf_b430cf;
          local_80.View_._M_str = (psVar9->_M_dataplus)._M_p;
          local_80.View_._M_len = psVar9->_M_string_length;
          cmStrCat<>(&local_50,(cmAlphaNum *)&srcs,&local_80);
          std::__cxx11::string::_M_assign((string *)&status->Error);
        }
        else {
LAB_002bd2d3:
          if (!bVar1) {
            if (TVar10 == UNKNOWN_LIBRARY) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&srcs,
                         "The UNKNOWN library type may be used only for IMPORTED libraries.",
                         (allocator<char> *)&local_80);
              cmMakefile::IssueMessage(this,FATAL_ERROR,(string *)&srcs);
              std::__cxx11::string::~string((string *)&srcs);
              return true;
            }
            goto LAB_002bd588;
          }
          if (!bVar2) {
LAB_002bd4b9:
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&srcs,"called with IMPORTED argument but no library type.",
                       (allocator<char> *)&local_80);
            std::__cxx11::string::_M_assign((string *)&status->Error);
            goto LAB_002bd183;
          }
          if (TVar10 == INTERFACE_LIBRARY) {
            bVar2 = cmGeneratorExpression::IsValidTargetName(psVar9);
            if (!bVar2) {
              srcs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x34;
              srcs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)anon_var_dwarf_b43068;
              local_80.View_._M_str = (psVar9->_M_dataplus)._M_p;
              local_80.View_._M_len = psVar9->_M_string_length;
              cmStrCat<>(&local_50,(cmAlphaNum *)&srcs,&local_80);
              std::__cxx11::string::_M_assign((string *)&status->Error);
              goto LAB_002bd7a4;
            }
            TVar10 = INTERFACE_LIBRARY;
          }
LAB_002bd447:
          pcVar7 = cmMakefile::FindTargetToUse(this,psVar9,false);
          if (pcVar7 == (cmTarget *)0x0) {
            cmMakefile::AddImportedTarget(this,psVar9,TVar10,global);
            return true;
          }
          srcs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x1f;
          srcs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)anon_var_dwarf_b375c8;
          local_80.View_._M_str = (psVar9->_M_dataplus)._M_p;
          local_80.View_._M_len = psVar9->_M_string_length;
          cmStrCat<char[60]>(&local_50,(cmAlphaNum *)&srcs,&local_80,
                             (char (*) [60])
                             "\" because another target with the same name already exists.");
          std::__cxx11::string::_M_assign((string *)&status->Error);
        }
LAB_002bd7a4:
        psVar9 = &local_50;
        goto LAB_002bd188;
      }
      bVar2 = cmGeneratorExpression::IsValidTargetName(psVar9);
      if (bVar2) {
        if (bVar5) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&srcs,"EXCLUDE_FROM_ALL with ALIAS makes no sense.",
                     (allocator<char> *)&local_80);
          std::__cxx11::string::_M_assign((string *)&status->Error);
        }
        else {
          if (!bVar1 && global == false) {
            if ((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start != 0x60) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&srcs,"ALIAS requires exactly one target argument.",
                         (allocator<char> *)&local_80);
              std::__cxx11::string::_M_assign((string *)&status->Error);
              goto LAB_002bd183;
            }
            PVar6 = cmMakefile::GetPolicyStatus(this,CMP0107,false);
            if ((PVar6 == NEW) &&
               (pcVar7 = cmMakefile::FindTargetToUse(this,psVar9,false), pcVar7 != (cmTarget *)0x0))
            {
              srcs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x1c;
              srcs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)anon_var_dwarf_b3755a;
              local_80.View_._M_str = (psVar9->_M_dataplus)._M_p;
              local_80.View_._M_len = psVar9->_M_string_length;
              cmStrCat<char[60]>(&local_50,(cmAlphaNum *)&srcs,&local_80,
                                 (char (*) [60])
                                 "\" because another target with the same name already exists.");
              std::__cxx11::string::_M_assign((string *)&status->Error);
            }
            else {
              bVar2 = cmMakefile::IsAlias(this,__first._M_current);
              if (bVar2) {
                srcs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x1c;
                srcs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)anon_var_dwarf_b3755a;
                local_80.View_._M_str = (psVar9->_M_dataplus)._M_p;
                local_80.View_._M_len = psVar9->_M_string_length;
                cmStrCat<char[19],std::__cxx11::string,char[22]>
                          (&local_50,(cmAlphaNum *)&srcs,&local_80,
                           (char (*) [19])"\" because target \"",__first._M_current,
                           (char (*) [22])"\" is itself an ALIAS.");
                std::__cxx11::string::_M_assign((string *)&status->Error);
              }
              else {
                pcVar7 = cmMakefile::FindTargetToUse(this,__first._M_current,true);
                if (pcVar7 == (cmTarget *)0x0) {
                  srcs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x1c;
                  srcs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)anon_var_dwarf_b3755a;
                  local_80.View_._M_str = (psVar9->_M_dataplus)._M_p;
                  local_80.View_._M_len = psVar9->_M_string_length;
                  cmStrCat<char[19],std::__cxx11::string,char[26]>
                            (&local_50,(cmAlphaNum *)&srcs,&local_80,
                             (char (*) [19])"\" because target \"",__first._M_current,
                             (char (*) [26])"\" does not already exist.");
                  std::__cxx11::string::_M_assign((string *)&status->Error);
                }
                else {
                  TVar10 = cmTarget::GetType(pcVar7);
                  if (((TVar10 - STATIC_LIBRARY < 4) || (TVar10 == INTERFACE_LIBRARY)) ||
                     ((TVar10 == UNKNOWN_LIBRARY && (bVar2 = cmTarget::IsImported(pcVar7), bVar2))))
                  {
                    bVar2 = cmTarget::IsImported(pcVar7);
                    bVar5 = true;
                    if (bVar2) {
                      bVar5 = cmTarget::IsImportedGloballyVisible(pcVar7);
                    }
                    cmMakefile::AddAlias(this,psVar9,__first._M_current,bVar5);
                    return true;
                  }
                  srcs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x1c;
                  srcs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)anon_var_dwarf_b3755a;
                  local_80.View_._M_str = (psVar9->_M_dataplus)._M_p;
                  local_80.View_._M_len = psVar9->_M_string_length;
                  cmStrCat<char[19],std::__cxx11::string,char[20]>
                            (&local_50,(cmAlphaNum *)&srcs,&local_80,
                             (char (*) [19])"\" because target \"",__first._M_current,
                             (char (*) [20])"\" is not a library.");
                  std::__cxx11::string::_M_assign((string *)&status->Error);
                }
              }
            }
            goto LAB_002bd7a4;
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&srcs,"IMPORTED with ALIAS is not allowed.",
                     (allocator<char> *)&local_80);
          std::__cxx11::string::_M_assign((string *)&status->Error);
        }
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&srcs,
                       "Invalid name for ALIAS: ",psVar9);
        std::__cxx11::string::_M_assign((string *)&status->Error);
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&srcs,"INTERFACE library specified as GLOBAL, but not as IMPORTED.",
                 (allocator<char> *)&local_80);
      std::__cxx11::string::_M_assign((string *)&status->Error);
    }
  }
LAB_002bd183:
  psVar9 = (string *)&srcs;
LAB_002bd188:
  std::__cxx11::string::~string((string *)psVar9);
  return false;
}

Assistant:

bool cmAddLibraryCommand(std::vector<std::string> const& args,
                         cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  cmMakefile& mf = status.GetMakefile();
  // Library type defaults to value of BUILD_SHARED_LIBS, if it exists,
  // otherwise it defaults to static library.
  cmStateEnums::TargetType type = cmStateEnums::SHARED_LIBRARY;
  if (cmIsOff(mf.GetDefinition("BUILD_SHARED_LIBS"))) {
    type = cmStateEnums::STATIC_LIBRARY;
  }
  bool excludeFromAll = false;
  bool importTarget = false;
  bool importGlobal = false;

  auto s = args.begin();

  std::string const& libName = *s;

  ++s;

  // If the second argument is "SHARED" or "STATIC", then it controls
  // the type of library.  Otherwise, it is treated as a source or
  // source list name. There may be two keyword arguments, check for them
  bool haveSpecifiedType = false;
  bool isAlias = false;
  while (s != args.end()) {
    std::string libType = *s;
    if (libType == "STATIC") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        status.SetError(
          "INTERFACE library specified with conflicting STATIC type.");
        return false;
      }
      ++s;
      type = cmStateEnums::STATIC_LIBRARY;
      haveSpecifiedType = true;
    } else if (libType == "SHARED") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        status.SetError(
          "INTERFACE library specified with conflicting SHARED type.");
        return false;
      }
      ++s;
      type = cmStateEnums::SHARED_LIBRARY;
      haveSpecifiedType = true;
    } else if (libType == "MODULE") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        status.SetError(
          "INTERFACE library specified with conflicting MODULE type.");
        return false;
      }
      ++s;
      type = cmStateEnums::MODULE_LIBRARY;
      haveSpecifiedType = true;
    } else if (libType == "OBJECT") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        status.SetError(
          "INTERFACE library specified with conflicting OBJECT type.");
        return false;
      }
      ++s;
      type = cmStateEnums::OBJECT_LIBRARY;
      haveSpecifiedType = true;
    } else if (libType == "UNKNOWN") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        status.SetError(
          "INTERFACE library specified with conflicting UNKNOWN type.");
        return false;
      }
      ++s;
      type = cmStateEnums::UNKNOWN_LIBRARY;
      haveSpecifiedType = true;
    } else if (libType == "ALIAS") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        status.SetError(
          "INTERFACE library specified with conflicting ALIAS type.");
        return false;
      }
      ++s;
      isAlias = true;
    } else if (libType == "INTERFACE") {
      if (haveSpecifiedType) {
        status.SetError(
          "INTERFACE library specified with conflicting/multiple types.");
        return false;
      }
      if (isAlias) {
        status.SetError(
          "INTERFACE library specified with conflicting ALIAS type.");
        return false;
      }
      ++s;
      type = cmStateEnums::INTERFACE_LIBRARY;
      haveSpecifiedType = true;
    } else if (*s == "EXCLUDE_FROM_ALL") {
      ++s;
      excludeFromAll = true;
    } else if (*s == "IMPORTED") {
      ++s;
      importTarget = true;
    } else if (importTarget && *s == "GLOBAL") {
      ++s;
      importGlobal = true;
    } else if (type == cmStateEnums::INTERFACE_LIBRARY && *s == "GLOBAL") {
      status.SetError(
        "GLOBAL option may only be used with IMPORTED libraries.");
      return false;
    } else {
      break;
    }
  }

  if (importTarget && !importGlobal) {
    importGlobal = mf.IsImportedTargetGlobalScope();
  }

  if (type == cmStateEnums::INTERFACE_LIBRARY) {
    if (importGlobal && !importTarget) {
      status.SetError(
        "INTERFACE library specified as GLOBAL, but not as IMPORTED.");
      return false;
    }
  }

  bool nameOk = cmGeneratorExpression::IsValidTargetName(libName) &&
    !cmGlobalGenerator::IsReservedTarget(libName);

  if (nameOk && !importTarget && !isAlias) {
    nameOk = libName.find(':') == std::string::npos;
  }
  if (!nameOk && !mf.CheckCMP0037(libName, type)) {
    return false;
  }

  if (isAlias) {
    if (!cmGeneratorExpression::IsValidTargetName(libName)) {
      status.SetError("Invalid name for ALIAS: " + libName);
      return false;
    }
    if (excludeFromAll) {
      status.SetError("EXCLUDE_FROM_ALL with ALIAS makes no sense.");
      return false;
    }
    if (importTarget || importGlobal) {
      status.SetError("IMPORTED with ALIAS is not allowed.");
      return false;
    }
    if (args.size() != 3) {
      status.SetError("ALIAS requires exactly one target argument.");
      return false;
    }

    if (mf.GetPolicyStatus(cmPolicies::CMP0107) == cmPolicies::NEW) {
      // Make sure the target does not already exist.
      if (mf.FindTargetToUse(libName)) {
        status.SetError(cmStrCat(
          "cannot create ALIAS target \"", libName,
          "\" because another target with the same name already exists."));
        return false;
      }
    }

    std::string const& aliasedName = *s;
    if (mf.IsAlias(aliasedName)) {
      status.SetError(cmStrCat("cannot create ALIAS target \"", libName,
                               "\" because target \"", aliasedName,
                               "\" is itself an ALIAS."));
      return false;
    }
    cmTarget* aliasedTarget = mf.FindTargetToUse(aliasedName, true);
    if (!aliasedTarget) {
      status.SetError(cmStrCat("cannot create ALIAS target \"", libName,
                               "\" because target \"", aliasedName,
                               "\" does not already exist."));
      return false;
    }
    cmStateEnums::TargetType aliasedType = aliasedTarget->GetType();
    if (aliasedType != cmStateEnums::SHARED_LIBRARY &&
        aliasedType != cmStateEnums::STATIC_LIBRARY &&
        aliasedType != cmStateEnums::MODULE_LIBRARY &&
        aliasedType != cmStateEnums::OBJECT_LIBRARY &&
        aliasedType != cmStateEnums::INTERFACE_LIBRARY &&
        !(aliasedType == cmStateEnums::UNKNOWN_LIBRARY &&
          aliasedTarget->IsImported())) {
      status.SetError(cmStrCat("cannot create ALIAS target \"", libName,
                               "\" because target \"", aliasedName,
                               "\" is not a library."));
      return false;
    }
    mf.AddAlias(libName, aliasedName,
                !aliasedTarget->IsImported() ||
                  aliasedTarget->IsImportedGloballyVisible());
    return true;
  }

  if (importTarget && excludeFromAll) {
    status.SetError("excludeFromAll with IMPORTED target makes no sense.");
    return false;
  }

  /* ideally we should check whether for the linker language of the target
    CMAKE_${LANG}_CREATE_SHARED_LIBRARY is defined and if not default to
    STATIC. But at this point we know only the name of the target, but not
    yet its linker language. */
  if ((type == cmStateEnums::SHARED_LIBRARY ||
       type == cmStateEnums::MODULE_LIBRARY) &&
      !mf.GetState()->GetGlobalPropertyAsBool("TARGET_SUPPORTS_SHARED_LIBS")) {
    mf.IssueMessage(
      MessageType::AUTHOR_WARNING,
      cmStrCat(
        "ADD_LIBRARY called with ",
        (type == cmStateEnums::SHARED_LIBRARY ? "SHARED" : "MODULE"),
        " option but the target platform does not support dynamic linking. ",
        "Building a STATIC library instead. This may lead to problems."));
    type = cmStateEnums::STATIC_LIBRARY;
  }

  // Handle imported target creation.
  if (importTarget) {
    // The IMPORTED signature requires a type to be specified explicitly.
    if (!haveSpecifiedType) {
      status.SetError("called with IMPORTED argument but no library type.");
      return false;
    }
    if (type == cmStateEnums::INTERFACE_LIBRARY) {
      if (!cmGeneratorExpression::IsValidTargetName(libName)) {
        status.SetError(cmStrCat(
          "Invalid name for IMPORTED INTERFACE library target: ", libName));
        return false;
      }
    }

    // Make sure the target does not already exist.
    if (mf.FindTargetToUse(libName)) {
      status.SetError(cmStrCat(
        "cannot create imported target \"", libName,
        "\" because another target with the same name already exists."));
      return false;
    }

    // Create the imported target.
    mf.AddImportedTarget(libName, type, importGlobal);
    return true;
  }

  // A non-imported target may not have UNKNOWN type.
  if (type == cmStateEnums::UNKNOWN_LIBRARY) {
    mf.IssueMessage(
      MessageType::FATAL_ERROR,
      "The UNKNOWN library type may be used only for IMPORTED libraries.");
    return true;
  }

  // Enforce name uniqueness.
  {
    std::string msg;
    if (!mf.EnforceUniqueName(libName, msg)) {
      status.SetError(msg);
      return false;
    }
  }

  if (type == cmStateEnums::INTERFACE_LIBRARY) {
    if (!cmGeneratorExpression::IsValidTargetName(libName) ||
        libName.find("::") != std::string::npos) {
      status.SetError(
        cmStrCat("Invalid name for INTERFACE library target: ", libName));
      return false;
    }
  }

  std::vector<std::string> srcs(s, args.end());
  mf.AddLibrary(libName, type, srcs, excludeFromAll);

  return true;
}